

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

X509_EXTENSION * do_ext_nconf(CONF *conf,X509V3_CTX *ctx,int ext_nid,int crit,char *value)

{
  X509V3_EXT_METHOD *method_00;
  size_t sVar1;
  char *pcVar2;
  ASN1_VALUE *local_58;
  void *ext_struc;
  stack_st_CONF_VALUE *nval_owned;
  stack_st_CONF_VALUE *nval;
  X509_EXTENSION *ext;
  X509V3_EXT_METHOD *method;
  char *value_local;
  int crit_local;
  int ext_nid_local;
  X509V3_CTX *ctx_local;
  CONF *conf_local;
  
  ext_struc = (void *)0x0;
  if (ext_nid == 0) {
    ERR_put_error(0x14,0,0x9e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                  ,0x5f);
    conf_local = (CONF *)0x0;
  }
  else {
    method_00 = X509V3_EXT_get_nid(ext_nid);
    if (method_00 == (X509V3_EXT_METHOD *)0x0) {
      ERR_put_error(0x14,0,0x9d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                    ,99);
      conf_local = (CONF *)0x0;
    }
    else {
      if (method_00->v2i == (X509V3_EXT_V2I)0x0) {
        if (method_00->s2i == (X509V3_EXT_S2I)0x0) {
          if (method_00->r2i == (X509V3_EXT_R2I)0x0) {
            ERR_put_error(0x14,0,0x73,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                          ,0x91);
            pcVar2 = OBJ_nid2sn(ext_nid);
            ERR_add_error_data(2,"name=",pcVar2);
            return (X509_EXTENSION *)0x0;
          }
          if (ctx->db == (CONF *)0x0) {
            ERR_put_error(0x14,0,0x8b,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                          ,0x8a);
            return (X509_EXTENSION *)0x0;
          }
          local_58 = (ASN1_VALUE *)(*method_00->r2i)(method_00,(v3_ext_ctx *)ctx,value);
          if (local_58 == (ASN1_VALUE *)0x0) {
            return (X509_EXTENSION *)0x0;
          }
        }
        else {
          local_58 = (ASN1_VALUE *)(*method_00->s2i)(method_00,(v3_ext_ctx *)ctx,value);
          if (local_58 == (ASN1_VALUE *)0x0) {
            return (X509_EXTENSION *)0x0;
          }
        }
      }
      else {
        if (*value == '@') {
          if (conf == (CONF *)0x0) {
            ERR_put_error(0x14,0,0x8b,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                          ,0x6d);
            return (X509_EXTENSION *)0x0;
          }
          nval_owned = (stack_st_CONF_VALUE *)NCONF_get_section((CONF *)conf,value + 1);
        }
        else {
          ext_struc = X509V3_parse_list(value);
          nval_owned = (stack_st_CONF_VALUE *)ext_struc;
        }
        if ((nval_owned == (stack_st_CONF_VALUE *)0x0) ||
           (sVar1 = sk_CONF_VALUE_num(nval_owned), sVar1 == 0)) {
          ERR_put_error(0x14,0,0x79,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                        ,0x76);
          pcVar2 = OBJ_nid2sn(ext_nid);
          ERR_add_error_data(4,"name=",pcVar2,",section=",value);
          sk_CONF_VALUE_pop_free((stack_st_CONF_VALUE *)ext_struc,X509V3_conf_free);
          return (X509_EXTENSION *)0x0;
        }
        local_58 = (ASN1_VALUE *)
                   (*method_00->v2i)(method_00,(v3_ext_ctx *)ctx,(stack_st_CONF_VALUE *)nval_owned);
        sk_CONF_VALUE_pop_free((stack_st_CONF_VALUE *)ext_struc,X509V3_conf_free);
        if (local_58 == (ASN1_VALUE *)0x0) {
          return (X509_EXTENSION *)0x0;
        }
      }
      conf_local = (CONF *)do_ext_i2d((X509V3_EXT_METHOD *)method_00,ext_nid,crit,local_58);
      ASN1_item_free(local_58,method_00->it);
    }
  }
  return (X509_EXTENSION *)conf_local;
}

Assistant:

static X509_EXTENSION *do_ext_nconf(const CONF *conf, const X509V3_CTX *ctx,
                                    int ext_nid, int crit, const char *value) {
  const X509V3_EXT_METHOD *method;
  X509_EXTENSION *ext;
  const STACK_OF(CONF_VALUE) *nval;
  STACK_OF(CONF_VALUE) *nval_owned = NULL;
  void *ext_struc;
  if (ext_nid == NID_undef) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_EXTENSION_NAME);
    return NULL;
  }
  if (!(method = X509V3_EXT_get_nid(ext_nid))) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_EXTENSION);
    return NULL;
  }
  // Now get internal extension representation based on type
  if (method->v2i) {
    if (*value == '@') {
      // TODO(davidben): This is the only place where |X509V3_EXT_nconf|'s
      // |conf| parameter is used. All other codepaths use the copy inside
      // |ctx|. Should this be switched and then the parameter ignored?
      if (conf == NULL) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_CONFIG_DATABASE);
        return NULL;
      }
      nval = NCONF_get_section(conf, value + 1);
    } else {
      nval_owned = X509V3_parse_list(value);
      nval = nval_owned;
    }
    if (nval == NULL || sk_CONF_VALUE_num(nval) <= 0) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_EXTENSION_STRING);
      ERR_add_error_data(4, "name=", OBJ_nid2sn(ext_nid), ",section=", value);
      sk_CONF_VALUE_pop_free(nval_owned, X509V3_conf_free);
      return NULL;
    }
    ext_struc = method->v2i(method, ctx, nval);
    sk_CONF_VALUE_pop_free(nval_owned, X509V3_conf_free);
    if (!ext_struc) {
      return NULL;
    }
  } else if (method->s2i) {
    if (!(ext_struc = method->s2i(method, ctx, value))) {
      return NULL;
    }
  } else if (method->r2i) {
    // TODO(davidben): Should this check be removed? This matches OpenSSL, but
    // r2i-based extensions do not necessarily require a config database. The
    // two built-in extensions only use it some of the time, and already handle
    // |X509V3_get_section| returning NULL.
    if (!ctx->db) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_CONFIG_DATABASE);
      return NULL;
    }
    if (!(ext_struc = method->r2i(method, ctx, value))) {
      return NULL;
    }
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_SETTING_NOT_SUPPORTED);
    ERR_add_error_data(2, "name=", OBJ_nid2sn(ext_nid));
    return NULL;
  }

  ext = do_ext_i2d(method, ext_nid, crit, ext_struc);
  ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ext_struc),
                 ASN1_ITEM_ptr(method->it));
  return ext;
}